

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ct.cpp
# Opt level: O0

COMPOUND_TEXT_CONVERTERS getState(int codepoint)

{
  COMPOUND_TEXT_CONVERTERS local_10;
  COMPOUND_TEXT_CONVERTERS state;
  int codepoint_local;
  
  local_10 = DO_SEARCH;
  if (((((codepoint == 0) || (codepoint == 9)) || (codepoint == 10)) ||
      ((0x1f < codepoint && (codepoint < 0x80)))) || ((0x9f < codepoint && (codepoint < 0x100)))) {
    local_10 = COMPOUND_TEXT_SINGLE_0;
  }
  else if ((((((codepoint < 0x102) || (0x107 < codepoint)) &&
             ((codepoint < 0x10c || (0x111 < codepoint)))) &&
            ((((codepoint < 0x118 || (0x11b < codepoint)) && (codepoint != 0x139)) &&
             ((codepoint != 0x13a && (codepoint != 0x13d)))))) && (codepoint != 0x13e)) &&
          ((((codepoint < 0x141 || (0x144 < codepoint)) &&
            ((codepoint != 0x147 &&
             (((codepoint != 0x147 && (codepoint != 0x150)) && (codepoint != 0x151)))))) &&
           (((((codepoint != 0x154 && (codepoint != 0x155)) &&
              ((codepoint < 0x158 || (0x15b < codepoint)))) &&
             (((((codepoint != 0x15e && (codepoint != 0x15f)) &&
                ((codepoint < 0x160 || (0x165 < codepoint)))) &&
               ((((((codepoint != 0x16e && (codepoint != 0x16f)) && (codepoint != 0x170)) &&
                  (codepoint != 0x171)) && ((codepoint < 0x179 || (0x17e < codepoint)))) &&
                (codepoint != 0x2c7)))) && ((codepoint != 0x2d8 && (codepoint != 0x2d9)))))) &&
            ((codepoint != 0x2db && (codepoint != 0x2dd)))))))) {
    if (((((codepoint < 0x108) || (0x10b < codepoint)) && (codepoint != 0x11c)) &&
        (((codepoint != 0x11d && (codepoint != 0x120)) &&
         ((codepoint != 0x121 && ((codepoint < 0x124 || (0x127 < codepoint)))))))) &&
       (((codepoint != 0x134 &&
         (((codepoint != 0x135 && (codepoint != 0x15c)) && (codepoint != 0x15d)))) &&
        ((codepoint != 0x16c && (codepoint != 0x16d)))))) {
      if ((((((codepoint < 0x174) || (0x177 < codepoint)) &&
            ((codepoint != 0x1e0a &&
             ((((codepoint != 0x1e0b && (codepoint != 0x1e1e)) && (codepoint != 0x1e1f)) &&
              ((codepoint != 0x1e40 && (codepoint != 0x1e41)))))))) &&
           ((codepoint != 0x1e56 && ((codepoint != 0x1e57 && (codepoint != 0x1e60)))))) &&
          (((codepoint != 0x1e61 &&
            (((codepoint != 0x1e6a && (codepoint != 0x1e6b)) && (codepoint != 0x1ef2)))) &&
           (codepoint != 0x1ef3)))) && ((codepoint < 0x1e80 || (0x1e85 < codepoint)))) {
        if (((codepoint == 0x152) || (codepoint == 0x153)) ||
           ((codepoint == 0x178 || (codepoint == 0x20ac)))) {
          local_10 = IBM_923;
        }
        else if (((codepoint < 0xe01) || (0xe3a < codepoint)) &&
                ((codepoint < 0xe3f || (0xe5b < codepoint)))) {
          if ((((((codepoint == 0x100) || (codepoint == 0x101)) || (codepoint == 0x112)) ||
               (((codepoint == 0x113 || (codepoint == 0x116)) ||
                ((codepoint == 0x117 || ((codepoint == 0x122 || (codepoint == 0x123)))))))) ||
              ((0x127 < codepoint && (codepoint < 300)))) ||
             ((((codepoint == 0x12e || (codepoint == 0x12f)) ||
               ((0x135 < codepoint && (codepoint < 0x139)))) ||
              (((((((codepoint == 0x13b || (codepoint == 0x13c)) || (codepoint == 0x145)) ||
                  (codepoint == 0x146)) ||
                 (((0x149 < codepoint && (codepoint < 0x14e)) || (codepoint == 0x156)))) ||
                (((codepoint == 0x157 || ((0x165 < codepoint && (codepoint < 0x16c)))) ||
                 (codepoint == 0x172)))) || (codepoint == 0x173)))))) {
            local_10 = IBM_914;
          }
          else if ((((codepoint == 700) || (codepoint == 0x2bd)) ||
                   ((899 < codepoint && (codepoint < 0x3cf)))) || (codepoint == 0x2015)) {
            local_10 = COMPOUND_TEXT_SINGLE_2;
          }
          else if (((((codepoint == 0x60c) || (codepoint == 0x61b)) || (codepoint == 0x61f)) ||
                   ((0x620 < codepoint && (codepoint < 0x63b)))) ||
                  (((0x63f < codepoint && (codepoint < 0x653)) ||
                   ((((0x65f < codepoint && (codepoint < 0x66e)) || (codepoint == 0x200b)) ||
                    ((((0xfe6f < codepoint && (codepoint < 0xfe73)) || (codepoint == 0xfe74)) ||
                     ((0xfe75 < codepoint && (codepoint < 0xfebf)))))))))) {
            local_10 = COMPOUND_TEXT_SINGLE_3;
          }
          else if (((codepoint < 0x5d0) || (0x5ea < codepoint)) &&
                  ((codepoint != 0x2017 && (codepoint != 0x203e)))) {
            if (((codepoint < 0x401) || (0x45f < codepoint)) && (codepoint != 0x2116)) {
              if ((((codepoint == 0x11e) || (codepoint == 0x11f)) ||
                  ((codepoint == 0x130 || (codepoint == 0x131)))) ||
                 ((0x217 < codepoint && (codepoint < 0x21c)))) {
                local_10 = COMPOUND_TEXT_SINGLE_1;
              }
            }
            else {
              local_10 = IBM_915;
            }
          }
          else {
            local_10 = IBM_916;
          }
        }
        else {
          local_10 = IBM_874;
        }
      }
      else {
        local_10 = ISO_8859_14;
      }
    }
    else {
      local_10 = IBM_913;
    }
  }
  else {
    local_10 = IBM_912;
  }
  return local_10;
}

Assistant:

static COMPOUND_TEXT_CONVERTERS getState(int codepoint) {
    COMPOUND_TEXT_CONVERTERS state = DO_SEARCH;

    if (isASCIIRange(codepoint)) {
        state = COMPOUND_TEXT_SINGLE_0;
    } else if (isIBM912(codepoint)) {
        state = IBM_912;
    }else if (isIBM913(codepoint)) {
        state = IBM_913;
    } else if (isISO8859_14(codepoint)) {
        state = ISO_8859_14;
    } else if (isIBM923(codepoint)) {
        state = IBM_923;
    } else if (isIBM874(codepoint)) {
        state = IBM_874;
    } else if (isIBM914(codepoint)) {
        state = IBM_914;
    } else if (isCompoundS2(codepoint)) {
        state = COMPOUND_TEXT_SINGLE_2;
    } else if (isCompoundS3(codepoint)) {
        state = COMPOUND_TEXT_SINGLE_3;
    } else if (isIBM916(codepoint)) {
        state = IBM_916;
    } else if (isIBM915(codepoint)) {
        state = IBM_915;
    } else if (isCompoundS1(codepoint)) {
        state = COMPOUND_TEXT_SINGLE_1;
    }

    return state;
}